

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O1

void Hex::Hexdumper<char>::output_bin(ostream *os,remove_const_t<char> val)

{
  ostream *poVar1;
  int iVar2;
  ostream oVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  char bits [257];
  char acStack_13a [274];
  
  if (val == '\0') {
    uVar7 = 0;
  }
  else {
    uVar4 = 0;
    do {
      uVar7 = uVar4 + 1;
      acStack_13a[uVar4 + 2] = val & 1U | 0x30;
      if ((byte)val < 2) break;
      val = val >> 1;
      bVar9 = uVar4 < 0xff;
      uVar4 = uVar7;
    } while (bVar9);
  }
  iVar6 = (int)uVar7;
  acStack_13a[(uVar7 & 0xffffffff) + 2] = '\0';
  lVar8 = *(long *)(*(long *)os + -0x18);
  poVar1 = os + lVar8;
  iVar2 = *(int *)(os + lVar8 + 0x10);
  if (os[lVar8 + 0xe1] == (ostream)0x0) {
    oVar3 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = oVar3;
    poVar1[0xe1] = (ostream)0x1;
  }
  iVar5 = iVar2 - iVar6;
  if (iVar5 == 0 || iVar2 < iVar6) {
    *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 0;
  }
  else {
    acStack_13a[1] = ' ';
    if ((char)*(undefined4 *)(poVar1 + 0xe0) != '\0') {
      acStack_13a[1] = (char)*(undefined4 *)(poVar1 + 0xe0);
    }
    *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = (long)iVar5;
    std::__ostream_insert<char,std::char_traits<char>>(os,acStack_13a + 1,1);
  }
  if (0 < iVar6) {
    lVar8 = (uVar7 & 0xffffffff) + 1;
    do {
      acStack_13a[1] = acStack_13a[lVar8];
      std::__ostream_insert<char,std::char_traits<char>>(os,acStack_13a + 1,1);
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  return;
}

Assistant:

static void output_bin(std::ostream& os, std::remove_const_t<T> val)
    {
        char bits[257];
        int len = 0;
        while (val && len<256) {
            bits[len++] = (val&1) ? '1' : '0';
            val >>= 1;
        }
        bits[len] = 0;

        int width = os.width();
        char fill = os.fill();
        if (!fill) fill = ' ';
        if (width>len) {
            os << std::setw(width-len);
            os << fill;
        }
        else {
            os << std::setw(0);
        }

        for (int i=len-1 ; i>=0 ; i--)
            os << bits[i];
    }